

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArithExpr.cpp
# Opt level: O0

TypeDescriptor * __thiscall CallExpr::evaluate(CallExpr *this,SymTab *symTab)

{
  bool bVar1;
  CallStatement *this_00;
  Token local_a0;
  CallStatement *local_20;
  CallStatement *funcFinder;
  SymTab *symTab_local;
  CallExpr *this_local;
  
  funcFinder = (CallStatement *)symTab;
  symTab_local = (SymTab *)this;
  this_00 = (CallStatement *)operator_new(0xe0);
  CallStatement::CallStatement(this_00);
  local_20 = this_00;
  ExprNode::token(&local_a0,&this->super_ExprNode);
  bVar1 = CallStatement::callFinder(this_00,&local_a0);
  Token::~Token(&local_a0);
  if (bVar1) {
    (*(local_20->super_Function).super_Statement._vptr_Statement[1])(local_20,funcFinder);
  }
  return (TypeDescriptor *)0x0;
}

Assistant:

TypeDescriptor *CallExpr::evaluate(SymTab &symTab) {
    auto *funcFinder = new CallStatement;
    if(funcFinder->callFinder(token()))
        funcFinder->evaluate(symTab);
    return nullptr;
}